

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O2

void osssb_on_resize_screen(void)

{
  osgen_recalc_layout();
  osssb_redraw_if_needed();
  osssb_cursor_to_default_pos();
  return;
}

Assistant:

void osssb_on_resize_screen()
{
    /* recalculate the window layout */
    osgen_recalc_layout();

    /* immediately update the screen */
    osssb_redraw_if_needed();

    /* set the cursor back to the default position */
    osssb_cursor_to_default_pos();
}